

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O3

void __thiscall lzstring::LZString::CreateBaseDict(LZString *this,string *alphabet,CharDict *dict)

{
  mapped_type *pmVar1;
  ulong uVar2;
  
  std::
  _Hashtable<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&dict->_M_h);
  if (alphabet->_M_string_length != 0) {
    uVar2 = 0;
    do {
      pmVar1 = std::__detail::
               _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)dict,(alphabet->_M_dataplus)._M_p + uVar2);
      *pmVar1 = (mapped_type)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar2 < alphabet->_M_string_length);
  }
  return;
}

Assistant:

void LZString::CreateBaseDict(const std::string &alphabet, CharDict &dict)
{
	dict.clear();
	for (size_t index = 0; index < alphabet.size(); index++)
	{
		dict[alphabet[index]] = (char)index;
	}
}